

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_proxy_define_own_property
              (JSContext *ctx,JSValue obj,JSAtom prop,JSValue val,JSValue getter,JSValue setter,
              int flags)

{
  void *pvVar1;
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue v_02;
  JSValue v_03;
  JSValue op2;
  JSValue op2_00;
  JSValue op2_01;
  JSValue val_00;
  JSValue this_obj;
  JSValue op1;
  JSValue op1_00;
  JSValue op1_01;
  JSValue v_04;
  JSValue setter_00;
  JSValue v_05;
  int iVar2;
  uint uVar3;
  BOOL BVar4;
  JSProxyData *pJVar5;
  JSAtom in_ECX;
  JSContext *in_RDI;
  JSPropertyDescriptor *in_R8;
  JSContext *in_R9;
  JSValue JVar6;
  uint in_stack_00000028;
  JSAtom in_stack_0000006c;
  JSContext *in_stack_00000070;
  undefined1 in_stack_00000078 [16];
  JSValue in_stack_00000088;
  BOOL setting_not_configurable;
  JSPropertyDescriptor desc;
  JSValue args [3];
  JSObject *p;
  int ret;
  int res;
  JSValue desc_val;
  JSValue prop_val;
  JSValue ret1;
  JSValue method;
  JSProxyData *s;
  undefined8 in_stack_fffffffffffffe68;
  JSAtom atom;
  JSValueUnion *desc_00;
  JSContext *in_stack_fffffffffffffe70;
  JSContext *ctx_00;
  JSValueUnion in_stack_fffffffffffffe78;
  int64_t in_stack_fffffffffffffe80;
  JSContext *in_stack_fffffffffffffe90;
  JSValueUnion ctx_01;
  JSValueUnion ctx_02;
  JSValueUnion in_stack_fffffffffffffea8;
  int64_t in_stack_fffffffffffffeb0;
  JSValue in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffec8 [16];
  int64_t iVar7;
  JSContext *in_stack_fffffffffffffed8;
  JSValueUnion in_stack_fffffffffffffee0;
  JSValue *argv;
  int64_t in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffefc;
  uint in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  JSValue in_stack_ffffffffffffff08;
  JSValue in_stack_ffffffffffffff18;
  JSValueUnion local_c8;
  JSValueUnion in_stack_ffffffffffffffa0;
  JSValueUnion in_stack_ffffffffffffffa8;
  int64_t local_50;
  
  atom = (JSAtom)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  ctx_01.ptr = &stack0x00000018;
  ctx_02.ptr = &stack0x00000008;
  JVar6.tag = in_stack_fffffffffffffee8;
  JVar6.u.float64 = in_stack_fffffffffffffee0.float64;
  pJVar5 = get_proxy_method(in_stack_fffffffffffffed8,in_stack_fffffffffffffec8._8_8_,JVar6,
                            in_stack_fffffffffffffec8._4_4_);
  if (pJVar5 == (JSProxyData *)0x0) {
    return -1;
  }
  v_05.tag = local_50;
  v_05.u.ptr = in_stack_ffffffffffffffa8.ptr;
  iVar2 = JS_IsUndefined(v_05);
  if (iVar2 != 0) {
    iVar2 = JS_DefineProperty(in_stack_00000070,in_stack_00000088,in_stack_0000006c,
                              (JSValue)in_stack_00000078,getter,setter,flags);
    return iVar2;
  }
  JVar6 = JS_AtomToValue(in_stack_fffffffffffffe70,atom);
  iVar2 = JS_IsException(JVar6);
  if (iVar2 != 0) {
    v.tag = in_stack_fffffffffffffe80;
    v.u.ptr = in_stack_fffffffffffffe78.ptr;
    JS_FreeValue(in_stack_fffffffffffffe70,v);
    return -1;
  }
  ctx_00 = *(JSContext **)((long)ctx_01.ptr + 8);
  setter_00.tag = (int64_t)in_stack_ffffffffffffffa8.ptr;
  setter_00.u.float64 = in_stack_ffffffffffffffa0.float64;
  JVar6 = js_create_desc((JSContext *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                         in_stack_ffffffffffffff18,in_stack_ffffffffffffff08,setter_00,
                         in_stack_fffffffffffffefc);
  argv = (JSValue *)JVar6.tag;
  iVar2 = JS_IsException(JVar6);
  if (iVar2 != 0) {
    v_00.tag = in_stack_fffffffffffffe80;
    v_00.u.ptr = in_stack_fffffffffffffe78.ptr;
    JS_FreeValue(ctx_00,v_00);
    v_01.tag = in_stack_fffffffffffffe80;
    v_01.u.ptr = in_stack_fffffffffffffe78.ptr;
    JS_FreeValue(ctx_00,v_01);
    return -1;
  }
  local_c8 = (pJVar5->target).u;
  desc_00 = &local_c8;
  this_obj.tag = in_stack_fffffffffffffeb0;
  this_obj.u.ptr = in_stack_fffffffffffffea8.ptr;
  JVar6 = JS_CallFree((JSContext *)ctx_02.ptr,in_stack_fffffffffffffeb8,this_obj,ctx_01._4_4_,argv);
  iVar7 = JVar6.tag;
  v_02.tag = in_stack_fffffffffffffe80;
  v_02.u.ptr = in_stack_fffffffffffffe78.ptr;
  JS_FreeValue(ctx_00,v_02);
  v_03.tag = in_stack_fffffffffffffe80;
  v_03.u.ptr = in_stack_fffffffffffffe78.ptr;
  JS_FreeValue(ctx_00,v_03);
  v_04.tag = iVar7;
  v_04.u.float64 = JVar6.u.float64;
  iVar2 = JS_IsException(v_04);
  if (iVar2 != 0) {
    return -1;
  }
  val_00.tag = (int64_t)in_stack_fffffffffffffea8.ptr;
  val_00.u.ptr = ctx_02.ptr;
  iVar2 = JS_ToBoolFree((JSContext *)ctx_01.ptr,val_00);
  if (iVar2 == 0) {
    if ((in_stack_00000028 & 0x4000) == 0) {
      return 0;
    }
    JS_ThrowTypeError(in_RDI,"proxy: defineProperty exception");
    return -1;
  }
  pvVar1 = (pJVar5->target).u.ptr;
  iVar2 = JS_GetOwnPropertyInternal(in_R9,in_R8,(JSObject *)in_RDI,in_ECX);
  if (iVar2 < 0) {
    return -1;
  }
  uVar3 = (uint)((in_stack_00000028 & 0x101) == 0x100);
  if (iVar2 == 0) {
    if (((*(byte *)((long)pvVar1 + 5) & 1) != 0) && (uVar3 == 0)) {
      return 1;
    }
    goto LAB_0017ba75;
  }
  BVar4 = check_define_prop_flags(in_stack_ffffffffffffff00,in_stack_00000028);
  if ((BVar4 == 0) || (((in_stack_ffffffffffffff00 & 1) != 0 && (uVar3 != 0)))) goto LAB_0017ba60;
  if ((in_stack_00000028 & 0x1800) == 0) {
    if ((in_stack_00000028 & 0x2000) == 0) goto LAB_0017ba3e;
    if (((in_stack_ffffffffffffff00 & 3) != 2) || ((in_stack_00000028 & 2) != 0)) {
      if ((in_stack_ffffffffffffff00 & 3) == 0) {
        op1_01.tag = in_stack_fffffffffffffeb0;
        op1_01.u.ptr = in_stack_fffffffffffffea8.ptr;
        op2_01.tag = (int64_t)ctx_02.ptr;
        op2_01.u.ptr = ctx_01.ptr;
        iVar2 = js_same_value(in_stack_fffffffffffffe90,op1_01,op2_01);
joined_r0x0017b9b9:
        if (iVar2 == 0) goto LAB_0017ba60;
      }
      goto LAB_0017ba3e;
    }
  }
  else {
    if ((in_stack_ffffffffffffff00 & 0x11) == 0x10) {
      if (((in_stack_00000028 & 0x800) != 0) &&
         (op1.tag = in_stack_fffffffffffffeb0, op1.u.ptr = in_stack_fffffffffffffea8.ptr,
         op2.tag = (int64_t)ctx_02.ptr, op2.u.ptr = ctx_01.ptr,
         BVar4 = js_same_value(in_stack_fffffffffffffe90,op1,op2), BVar4 == 0)) goto LAB_0017ba60;
      if ((in_stack_00000028 & 0x1000) != 0) {
        op1_00.tag = in_stack_fffffffffffffeb0;
        op1_00.u.ptr = in_stack_fffffffffffffea8.ptr;
        op2_00.tag = (int64_t)ctx_02.ptr;
        op2_00.u.ptr = ctx_01.ptr;
        iVar2 = js_same_value(in_stack_fffffffffffffe90,op1_00,op2_00);
        goto joined_r0x0017b9b9;
      }
    }
LAB_0017ba3e:
    if (((in_stack_00000028 & 0x200) == 0) || ((in_stack_ffffffffffffff00 & 0x13) != 2)) {
      js_free_desc(ctx_00,(JSPropertyDescriptor *)desc_00);
      return 1;
    }
  }
LAB_0017ba60:
  js_free_desc(ctx_00,(JSPropertyDescriptor *)desc_00);
LAB_0017ba75:
  JS_ThrowTypeError(in_RDI,"proxy: inconsistent defineProperty");
  return -1;
}

Assistant:

static int js_proxy_define_own_property(JSContext *ctx, JSValueConst obj,
                                        JSAtom prop, JSValueConst val,
                                        JSValueConst getter, JSValueConst setter,
                                        int flags)
{
    JSProxyData *s;
    JSValue method, ret1, prop_val, desc_val;
    int res, ret;
    JSObject *p;
    JSValueConst args[3];
    JSPropertyDescriptor desc;
    BOOL setting_not_configurable;

    s = get_proxy_method(ctx, &method, obj, JS_ATOM_defineProperty);
    if (!s)
        return -1;
    if (JS_IsUndefined(method)) {
        return JS_DefineProperty(ctx, s->target, prop, val, getter, setter, flags);
    }
    prop_val = JS_AtomToValue(ctx, prop);
    if (JS_IsException(prop_val)) {
        JS_FreeValue(ctx, method);
        return -1;
    }
    desc_val = js_create_desc(ctx, val, getter, setter, flags);
    if (JS_IsException(desc_val)) {
        JS_FreeValue(ctx, prop_val);
        JS_FreeValue(ctx, method);
        return -1;
    }
    args[0] = s->target;
    args[1] = prop_val;
    args[2] = desc_val;
    ret1 = JS_CallFree(ctx, method, s->handler, 3, args);
    JS_FreeValue(ctx, prop_val);
    JS_FreeValue(ctx, desc_val);
    if (JS_IsException(ret1))
        return -1;
    ret = JS_ToBoolFree(ctx, ret1);
    if (!ret) {
        if (flags & JS_PROP_THROW) {
            JS_ThrowTypeError(ctx, "proxy: defineProperty exception");
            return -1;
        } else {
            return 0;
        }
    }
    p = JS_VALUE_GET_OBJ(s->target);
    res = JS_GetOwnPropertyInternal(ctx, &desc, p, prop);
    if (res < 0)
        return -1;
    setting_not_configurable = ((flags & (JS_PROP_HAS_CONFIGURABLE |
                                          JS_PROP_CONFIGURABLE)) ==
                                JS_PROP_HAS_CONFIGURABLE);
    if (!res) {
        if (!p->extensible || setting_not_configurable)
            goto fail;
    } else {
        if (!check_define_prop_flags(desc.flags, flags) ||
            ((desc.flags & JS_PROP_CONFIGURABLE) && setting_not_configurable)) {
            goto fail1;
        }
        if (flags & (JS_PROP_HAS_GET | JS_PROP_HAS_SET)) {
            if ((desc.flags & (JS_PROP_GETSET | JS_PROP_CONFIGURABLE)) ==
                JS_PROP_GETSET) {
                if ((flags & JS_PROP_HAS_GET) &&
                    !js_same_value(ctx, getter, desc.getter)) {
                    goto fail1;
                }
                if ((flags & JS_PROP_HAS_SET) &&
                    !js_same_value(ctx, setter, desc.setter)) {
                    goto fail1;
                }
            }
        } else if (flags & JS_PROP_HAS_VALUE) {
            if ((desc.flags & (JS_PROP_CONFIGURABLE | JS_PROP_WRITABLE)) ==
                JS_PROP_WRITABLE && !(flags & JS_PROP_WRITABLE)) {
                /* missing-proxy-check feature */
                goto fail1;
            } else if ((desc.flags & (JS_PROP_CONFIGURABLE | JS_PROP_WRITABLE)) == 0 &&
                !js_same_value(ctx, val, desc.value)) {
                goto fail1;
            }
        }
        if (flags & JS_PROP_HAS_WRITABLE) {
            if ((desc.flags & (JS_PROP_GETSET | JS_PROP_CONFIGURABLE |
                               JS_PROP_WRITABLE)) == JS_PROP_WRITABLE) {
                /* proxy-missing-checks */
            fail1:
                js_free_desc(ctx, &desc);
            fail:
                JS_ThrowTypeError(ctx, "proxy: inconsistent defineProperty");
                return -1;
            }
        }
        js_free_desc(ctx, &desc);
    }
    return 1;
}